

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

void __thiscall
Js::JavascriptLibrary::SetDispatchProfile
          (JavascriptLibrary *this,bool fSet,JavascriptMethod dispatchInvoke)

{
  HostScriptContext *pHVar1;
  undefined7 in_register_00000031;
  code *pcVar2;
  code *pcVar3;
  
  if ((int)CONCAT71(in_register_00000031,fSet) == 0) {
    this->inDispatchProfileMode = false;
    pcVar2 = JavascriptExternalFunction::StdCallExternalFunctionThunk;
    pcVar3 = JavascriptExternalFunction::ExternalFunctionThunk;
  }
  else {
    this->inDispatchProfileMode = true;
    pcVar3 = ScriptContext::DebugProfileProbeThunk;
    pcVar2 = ScriptContext::DebugProfileProbeThunk;
  }
  if (dispatchInvoke != (JavascriptMethod)0x0) {
    pHVar1 = ((this->super_JavascriptLibraryBase).scriptContext.ptr)->hostScriptContext;
    (*pHVar1->_vptr_HostScriptContext[0x10])(pHVar1,dispatchInvoke);
  }
  (((this->idMappedFunctionWithPrototypeType).ptr)->super_Type).entryPoint = pcVar3;
  (((this->externalFunctionWithDeferredPrototypeType).ptr)->super_Type).entryPoint = pcVar3;
  (((this->stdCallFunctionWithDeferredPrototypeType).ptr)->super_Type).entryPoint = pcVar2;
  return;
}

Assistant:

void JavascriptLibrary::SetDispatchProfile(bool fSet, JavascriptMethod dispatchInvoke)
    {
        if (!fSet)
        {
            this->inDispatchProfileMode = false;
            if (dispatchInvoke != nullptr)
            {
                this->GetScriptContext()->GetHostScriptContext()->SetDispatchInvoke(dispatchInvoke);
            }
            idMappedFunctionWithPrototypeType->SetEntryPoint(JavascriptExternalFunction::ExternalFunctionThunk);
            externalFunctionWithDeferredPrototypeType->SetEntryPoint(JavascriptExternalFunction::ExternalFunctionThunk);
            stdCallFunctionWithDeferredPrototypeType->SetEntryPoint(JavascriptExternalFunction::StdCallExternalFunctionThunk);
        }
        else
        {
            this->inDispatchProfileMode = true;
            if (dispatchInvoke != nullptr)
            {
                this->GetScriptContext()->GetHostScriptContext()->SetDispatchInvoke(dispatchInvoke);
            }
            idMappedFunctionWithPrototypeType->SetEntryPoint(ProfileEntryThunk);
            externalFunctionWithDeferredPrototypeType->SetEntryPoint(ProfileEntryThunk);
            stdCallFunctionWithDeferredPrototypeType->SetEntryPoint(ProfileEntryThunk);
        }
    }